

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_Time.cpp
# Opt level: O2

uint64_t __thiscall axl::sys::Time::getTimestampImpl(Time *this,bool isLocal,int timeZone)

{
  int iVar1;
  time_t tVar2;
  undefined7 in_register_00000031;
  tm local_48;
  
  local_48.tm_gmtoff = 0;
  local_48.tm_zone = (char *)0x0;
  local_48.tm_wday = 0;
  local_48.tm_yday = 0;
  local_48.tm_isdst = 0;
  local_48._36_4_ = 0;
  local_48.tm_year = this->m_year - 0x76c;
  local_48.tm_mon = (int)this->m_month;
  local_48.tm_mday = (int)this->m_monthDay;
  local_48.tm_hour = (int)this->m_hour;
  local_48.tm_min = (int)this->m_minute;
  local_48.tm_sec = (int)this->m_second;
  if ((int)CONCAT71(in_register_00000031,isLocal) == 0) {
    tVar2 = timegm(&local_48);
    if (timeZone - 100U < 0xffffff39) {
      iVar1 = (timeZone / 100) * -0x28 + timeZone;
    }
    else {
      iVar1 = timeZone * 0x3c;
    }
    tVar2 = tVar2 + iVar1 * 0x3c;
  }
  else {
    tVar2 = mktime(&local_48);
  }
  return (ulong)this->m_microSecond * 10 + (ulong)this->m_milliSecond * 10000 + tVar2 * 10000000 +
         0x19db1ded53e8000 + (ulong)(this->m_nanoSecond / 100);
}

Assistant:

uint64_t
Time::getTimestampImpl(
	bool isLocal,
	int timeZone
) const {
	uint64_t timestamp = 0;

#if (_AXL_OS_WIN)
	SYSTEMTIME sysTime = { 0 };
	sysTime.wYear   = m_year;
	sysTime.wMonth  = m_month + 1;
	sysTime.wDay    = m_monthDay;
	sysTime.wHour   = m_hour;
	sysTime.wMinute = m_minute;
	sysTime.wSecond = m_second;

	::SystemTimeToFileTime(&sysTime, (FILETIME*)&timestamp);

	if (isLocal)
		::FileTimeToLocalFileTime((const FILETIME*)&timestamp, (FILETIME*)&timestamp);
	else
		timestamp += (int64_t)getTimeZoneOffsetInMinutes(timeZone) * 60 * 10000000;

#else
	tm tmStruct = { 0 };
	tmStruct.tm_year = m_year - 1900;
	tmStruct.tm_mon  = m_month;
	tmStruct.tm_mday = m_monthDay;
	tmStruct.tm_hour = m_hour;
	tmStruct.tm_min  = m_minute;
	tmStruct.tm_sec  = m_second;

	time64_t posixTime = isLocal ?
		mktime64(&tmStruct) :
		timegm64(&tmStruct) + getTimeZoneOffsetInMinutes(timeZone) * 60;

	timestamp = (uint64_t)(posixTime + AXL_SYS_EPOCH_DIFF) * 10000000;
#endif

	return
		timestamp +
		m_milliSecond * 10000 +
		m_microSecond * 10 +
		m_nanoSecond / 100;
}